

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

void rcg::checkFeature(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                      bool igncache)

{
  bool bVar1;
  ostream *poVar2;
  invalid_argument *this;
  byte in_CL;
  char *in_RDX;
  char *in_RSI;
  ostringstream out;
  string cvalue;
  bool in_stack_000003fe;
  bool in_stack_000003ff;
  char *in_stack_00000400;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_00000408;
  char *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  string local_1e8 [32];
  ostringstream local_1c8 [392];
  string local_40 [39];
  byte local_19;
  char *local_18;
  char *local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  getString_abi_cxx11_(in_stack_00000408,in_stack_00000400,in_stack_000003ff,in_stack_000003fe);
  bVar1 = std::operator!=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  if ((bVar1) &&
     (bVar1 = std::operator!=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8), bVar1)) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = std::operator<<((ostream *)local_1c8,local_10);
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2," expected: ");
    std::operator<<(poVar2,local_40);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this,local_1e8);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void checkFeature(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                  const char *value, bool igncache)
{
  std::string cvalue=getString(nodemap, name, true, igncache);

  if (cvalue != "" && cvalue != value)
  {
    std::ostringstream out;
    out << name << " == " << value << " expected: " << cvalue;
    throw std::invalid_argument(out.str());
  }
}